

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft_reaper.cc
# Opt level: O0

bool __thiscall sptk::reaper::FFT::flog_mag(FFT *this,float *x,float *y,float *z,int n)

{
  ulong in_RCX;
  long in_RDX;
  long in_RSI;
  int in_R8D;
  float fVar1;
  double dVar2;
  float ssq;
  float t2;
  float t1;
  float *zp;
  float *yp;
  float *xp;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined1 local_1;
  
  if ((((in_RSI == 0) || (in_RDX == 0)) || (in_RCX == 0)) || (in_R8D == 0)) {
    local_1 = false;
  }
  else {
    local_48 = in_RCX + (long)in_R8D * 4;
    local_40 = in_RDX + (long)in_R8D * 4;
    local_38 = in_RSI + (long)in_R8D * 4;
    while (in_RCX < local_48) {
      fVar1 = *(float *)(local_38 + -4) * *(float *)(local_38 + -4) +
              *(float *)(local_40 + -4) * *(float *)(local_40 + -4);
      if (fVar1 <= 0.0) {
        fVar1 = -200.0;
      }
      else {
        dVar2 = std::log10((double)(ulong)(uint)fVar1);
        fVar1 = SUB84(dVar2,0) * 10.0;
      }
      *(float *)(local_48 - 4) = fVar1;
      local_48 = local_48 - 4;
      local_40 = local_40 + -4;
      local_38 = local_38 + -4;
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool FFT::flog_mag(float *x, float *y, float *z, int n) {
  float *xp, *yp, *zp, t1, t2, ssq;

  if (x && y && z && n) {
    for (xp = x + n, yp = y + n, zp = z + n; zp > z;) {
      t1 = *--xp;
      t2 = *--yp;
      ssq = (t1 * t1) + (t2 * t2);
      *--zp = (ssq > 0.0)? 10.0 * log10(ssq) : -200.0;
    }
    return true;
  } else {
    return false;
  }
}